

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeBBShaft::ArchiveOUT(ChConstraintThreeBBShaft *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChConstraintThreeBBShaft>(marchive);
  ChConstraintThree::ArchiveOUT(&this->super_ChConstraintThree,marchive);
  return;
}

Assistant:

void ChConstraintThreeBBShaft::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintThreeBBShaft>();

    // serialize the parent class data too
    ChConstraintThree::ArchiveOUT(marchive);

    // serialize all member data:
    // NOTHING INTERESTING TO SERIALIZE (the Cq jacobians are not so
    // important to waste disk space.. they may be recomputed run-time,
    // and pointers to variables must be rebound in run-time.)
    // mstream << Cq_a;
    // mstream << Cq_b;
}